

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

SparseNode *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::SparseNode>::New(Arena *arena)

{
  Arena *arena_local;
  SparseNode *local_28;
  SparseNode *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (SparseNode *)operator_new(0x20);
    CoreML::Specification::SparseNode::SparseNode(local_28);
  }
  else {
    local_28 = (SparseNode *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::SparseNode::typeinfo,0x20);
    CoreML::Specification::SparseNode::SparseNode(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::SparseNode>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }